

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  anon_enum_32 aVar1;
  size_t sVar2;
  archive *a;
  size_t sVar3;
  int iVar4;
  undefined8 uVar5;
  long lStack_68;
  int ret;
  size_t zstdret;
  size_t opos;
  size_t ipos;
  ZSTD_inBuffer in;
  size_t length_local;
  void *src_local;
  int flush_local;
  private_data_conflict9 *data_local;
  archive_write_filter *f_local;
  
  in.size = 0;
  ipos = (size_t)src;
  in.src = (void *)length;
  in.pos = length;
  do {
    sVar3 = in.size;
    sVar2 = (data->out).pos;
    aVar1 = data->state;
    if (aVar1 == running) {
      if ((void *)in.size == in.src) {
        return 0;
      }
      lStack_68 = ZSTD_compressStream(data->cstream,&data->out,&ipos);
      iVar4 = ZSTD_isError(lStack_68);
      if (iVar4 != 0) {
LAB_0017f6a1:
        a = f->archive;
        uVar5 = ZSTD_getErrorName(lStack_68);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar5);
        return -0x1e;
      }
    }
    else if (aVar1 == finishing) {
      lStack_68 = ZSTD_endStream(data->cstream,&data->out);
      iVar4 = ZSTD_isError(lStack_68);
      if (iVar4 != 0) goto LAB_0017f6a1;
      if (lStack_68 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
      data->state = running;
    }
    data->total_in = (in.size - sVar3) + data->total_in;
    data->cur_frame_in = (in.size - sVar3) + data->cur_frame_in;
    data->cur_frame_out = ((data->out).pos - sVar2) + data->cur_frame_out;
    if ((data->state == running) &&
       ((data->max_frame_in <= data->cur_frame_in || (data->max_frame_out <= data->cur_frame_out))))
    {
      data->state = finishing;
    }
    if (((data->out).pos == (data->out).size) || ((flush != 0 && ((data->out).pos != 0)))) {
      iVar4 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			data->total_out += data->compressed_buffer_size;
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = lzma_code(&(data->stream),
		    finishing ? LZMA_FINISH : LZMA_RUN );

		switch (ret) {
		case LZMA_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case LZMA_STREAM_END:
			/* This return can only occur in finishing case. */
			if (finishing)
				return (ARCHIVE_OK);
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression data error");
			return (ARCHIVE_FATAL);
		case LZMA_MEMLIMIT_ERROR:
			archive_set_error(f->archive, ENOMEM,
			    "lzma compression error: "
			    "%ju MiB would have been needed",
			    (uintmax_t)((lzma_memusage(&(data->stream))
				    + 1024 * 1024 -1)
				/ (1024 * 1024)));
			return (ARCHIVE_FATAL);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression failed:"
			    " lzma_code() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}